

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

common_init_result *
common_init_from_params(common_init_result *__return_storage_ptr__,common_params *params)

{
  pointer pcVar1;
  pointer pcVar2;
  bool bVar3;
  common_init_result *this;
  common_params *pcVar4;
  char cVar5;
  int iVar6;
  int32_t iVar7;
  int iVar8;
  uint uVar9;
  pointer __p;
  undefined8 uVar10;
  common_log *pcVar11;
  pointer __p_00;
  long lVar12;
  ulong uVar13;
  llama_model_params *plVar14;
  llama_context_params *plVar15;
  undefined8 *puVar16;
  pointer pcVar17;
  bool bVar18;
  byte bVar19;
  undefined4 local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  undefined4 local_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined8 local_218;
  llama_context *local_1c8;
  common_init_result *local_1c0;
  common_control_vector_data cvec;
  llama_token decoder_start_token_id;
  llama_token bos;
  llama_token eos;
  undefined8 local_180;
  vector<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>,std::allocator<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>>>
  *local_178;
  vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_> *local_170;
  common_params *local_168;
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined8 local_130;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined8 local_f8;
  llama_model_params mparams;
  llama_context_params cparams;
  
  bVar19 = 0;
  (__return_storage_ptr__->lora).
  super__Vector_base<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>,_std::allocator<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->lora).
  super__Vector_base<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>,_std::allocator<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->model)._M_t.super___uniq_ptr_impl<llama_model,_llama_model_deleter>._M_t.
  super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
  super__Head_base<0UL,_llama_model_*,_false>._M_head_impl = (llama_model *)0x0;
  (__return_storage_ptr__->context)._M_t.super___uniq_ptr_impl<llama_context,_llama_context_deleter>
  ._M_t.super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
  super__Head_base<0UL,_llama_context_*,_false>._M_head_impl = (llama_context *)0x0;
  (__return_storage_ptr__->lora).
  super__Vector_base<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>,_std::allocator<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  common_model_params_to_llama(&mparams,params);
  pcVar1 = (params->model).path._M_dataplus._M_p;
  plVar14 = &mparams;
  puVar16 = (undefined8 *)&local_248;
  for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
    *puVar16 = plVar14->devices;
    plVar14 = (llama_model_params *)((long)plVar14 + (ulong)bVar19 * -0x10 + 8);
    puVar16 = puVar16 + (ulong)bVar19 * -2 + 1;
  }
  __p = (pointer)llama_model_load_from_file(pcVar1);
  if (__p == (pointer)0x0) {
    if (common_log_verbosity_thold < 0) {
      return __return_storage_ptr__;
    }
    pcVar11 = common_log_main();
    common_log_add(pcVar11,GGML_LOG_LEVEL_ERROR,"%s: failed to load model \'%s\'\n",
                   "common_init_from_params",(params->model).path._M_dataplus._M_p);
    return __return_storage_ptr__;
  }
  uVar10 = llama_model_get_vocab(__p);
  if (params->reranking == true) {
    iVar6 = llama_vocab_bos(uVar10);
    bVar18 = iVar6 != -1;
    if ((!bVar18) && (-1 < common_log_verbosity_thold)) {
      pcVar11 = common_log_main();
      common_log_add(pcVar11,GGML_LOG_LEVEL_WARN,
                     "%s: warning: vocab does not have a  BOS token, reranking will not work\n",
                     "common_init_from_params");
    }
    iVar6 = llama_vocab_eos(uVar10);
    if (iVar6 == -1) {
      if (common_log_verbosity_thold < 0) {
        bVar18 = false;
      }
      else {
        pcVar11 = common_log_main();
        bVar18 = false;
        common_log_add(pcVar11,GGML_LOG_LEVEL_WARN,
                       "%s: warning: vocab does not have an EOS token, reranking will not work\n",
                       "common_init_from_params");
      }
    }
    iVar6 = llama_vocab_sep(uVar10);
    if (iVar6 == -1) {
      if (-1 < common_log_verbosity_thold) {
        pcVar11 = common_log_main();
        common_log_add(pcVar11,GGML_LOG_LEVEL_WARN,
                       "%s: warning: vocab does not have a  SEP token, reranking will not work\n",
                       "common_init_from_params");
      }
LAB_001bacf8:
      llama_model_free(__p);
      return __return_storage_ptr__;
    }
    if (!bVar18) goto LAB_001bacf8;
  }
  local_180 = uVar10;
  common_context_params_to_llama(&cparams,params);
  plVar15 = &cparams;
  puVar16 = (undefined8 *)&local_248;
  for (lVar12 = 0xf; lVar12 != 0; lVar12 = lVar12 + -1) {
    *puVar16 = *(undefined8 *)plVar15;
    plVar15 = (llama_context_params *)((long)plVar15 + (ulong)bVar19 * -0x10 + 8);
    puVar16 = puVar16 + (ulong)bVar19 * -2 + 1;
  }
  local_1c8 = (llama_context *)llama_init_from_model(__p);
  if (local_1c8 == (llama_context *)0x0) {
    if (-1 < common_log_verbosity_thold) {
      pcVar11 = common_log_main();
      common_log_add(pcVar11,GGML_LOG_LEVEL_ERROR,"%s: failed to create context with model \'%s\'\n"
                     ,"common_init_from_params",(params->model).path._M_dataplus._M_p);
    }
    llama_model_free(__p);
    return __return_storage_ptr__;
  }
  if ((params->ctx_shift == true) && (cVar5 = llama_kv_self_can_shift(local_1c8), cVar5 == '\0')) {
    if (-1 < common_log_verbosity_thold) {
      pcVar11 = common_log_main();
      common_log_add(pcVar11,GGML_LOG_LEVEL_WARN,
                     "%s: KV cache shifting is not supported for this context, disabling KV cache shifting\n"
                     ,"common_init_from_params");
    }
    params->ctx_shift = false;
  }
  if ((params->control_vectors).
      super__Vector_base<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (params->control_vectors).
      super__Vector_base<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar18 = false;
  }
  else {
    if (params->control_vector_layer_start < 1) {
      params->control_vector_layer_start = 1;
    }
    if (params->control_vector_layer_end < 1) {
      iVar7 = llama_model_n_layer(__p);
      params->control_vector_layer_end = iVar7;
    }
    common_control_vector_load(&cvec,&params->control_vectors);
    if (cvec.n_embd == -1) {
      llama_free(local_1c8);
      llama_model_free(__p);
LAB_001bad29:
      bVar18 = true;
      bVar3 = false;
    }
    else {
      iVar6 = llama_apply_adapter_cvec
                        (local_1c8,
                         cvec.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (long)cvec.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)cvec.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start >> 2,cvec._0_8_ & 0xffffffff,
                         params->control_vector_layer_start,params->control_vector_layer_end);
      if (iVar6 != 0) {
        llama_free(local_1c8);
        llama_model_free(__p);
        goto LAB_001bad29;
      }
      bVar3 = true;
      bVar18 = false;
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&cvec.data.super__Vector_base<float,_std::allocator<float>_>);
    if (!bVar3) {
      if (bVar18) {
        return __return_storage_ptr__;
      }
      goto LAB_001baf8a;
    }
  }
  local_170 = &params->lora_adapters;
  pcVar17 = (params->lora_adapters).
            super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (params->lora_adapters).
           super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_178 = (vector<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>,std::allocator<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>>>
               *)&__return_storage_ptr__->lora;
  local_1c0 = __return_storage_ptr__;
  local_168 = params;
  do {
    pcVar4 = local_168;
    this = local_1c0;
    if (pcVar17 == pcVar2) {
      if (local_168->lora_init_without_apply == false) {
        common_set_adapter_lora(local_1c8,local_170);
      }
      bVar19 = (pcVar4->sampling).ignore_eos;
      if ((bool)bVar19 == true) {
        iVar6 = llama_vocab_eos(local_180);
        if (iVar6 == -1) {
          if (-1 < common_log_verbosity_thold) {
            pcVar11 = common_log_main();
            common_log_add(pcVar11,GGML_LOG_LEVEL_WARN,
                           "%s: warning: vocab does not have an EOS token, ignoring --ignore-eos\n",
                           "common_init_from_params");
          }
          (pcVar4->sampling).ignore_eos = false;
LAB_001bafcb:
          if ((pcVar4->sampling).penalty_last_n == -1) {
            if (-1 < common_log_verbosity_thold) {
              pcVar11 = common_log_main();
              uVar9 = llama_n_ctx(local_1c8);
              common_log_add(pcVar11,GGML_LOG_LEVEL_INFO,
                             "%s: setting penalty_last_n to ctx_size = %d\n",
                             "common_init_from_params",(ulong)uVar9);
            }
            iVar7 = llama_n_ctx(local_1c8);
            (pcVar4->sampling).penalty_last_n = iVar7;
          }
          if ((pcVar4->sampling).dry_penalty_last_n == -1) {
            if (-1 < common_log_verbosity_thold) {
              pcVar11 = common_log_main();
              uVar9 = llama_n_ctx(local_1c8);
              common_log_add(pcVar11,GGML_LOG_LEVEL_INFO,
                             "%s: setting dry_penalty_last_n to ctx_size = %d\n",
                             "common_init_from_params",(ulong)uVar9);
            }
            iVar7 = llama_n_ctx(local_1c8);
            (pcVar4->sampling).dry_penalty_last_n = iVar7;
          }
          if (pcVar4->warmup == true) {
            if (-1 < common_log_verbosity_thold) {
              pcVar11 = common_log_main();
              common_log_add(pcVar11,GGML_LOG_LEVEL_WARN,
                             "%s: warming up the model with an empty run - please wait ... (--no-warmup to disable)\n"
                             ,"common_init_from_params");
            }
            llama_set_warmup(local_1c8,1);
            uVar10 = local_180;
            cvec.n_embd = 0;
            cvec._4_4_ = 0;
            cvec.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            cvec.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            bos = llama_vocab_bos(local_180);
            eos = llama_vocab_eos(uVar10);
            if (bos != -1) {
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)&cvec,&bos);
            }
            if (eos != -1) {
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)&cvec,&eos);
            }
            if ((pointer)cvec._0_8_ ==
                cvec.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start) {
              decoder_start_token_id = 0;
              std::vector<int,_std::allocator<int>_>::emplace_back<int>
                        ((vector<int,_std::allocator<int>_> *)&cvec,&decoder_start_token_id);
            }
            cVar5 = llama_model_has_encoder(__p);
            if (cVar5 != '\0') {
              llama_batch_get_one(&local_128,cvec._0_8_,
                                  (ulong)((long)cvec.data.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_start -
                                         cvec._0_8_) >> 2);
              local_218 = local_f8;
              local_228 = local_108;
              uStack_224 = uStack_104;
              uStack_220 = uStack_100;
              uStack_21c = uStack_fc;
              local_238 = local_118;
              uStack_234 = uStack_114;
              uStack_230 = uStack_110;
              uStack_22c = uStack_10c;
              local_248 = local_128;
              uStack_244 = uStack_124;
              uStack_240 = uStack_120;
              uStack_23c = uStack_11c;
              llama_encode(local_1c8);
              decoder_start_token_id = llama_model_decoder_start_token(__p);
              if (decoder_start_token_id == -1) {
                decoder_start_token_id = bos;
              }
              if (cvec.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)cvec._0_8_) {
                cvec.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)cvec._0_8_;
              }
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)&cvec,&decoder_start_token_id);
            }
            cVar5 = llama_model_has_decoder(__p);
            if (cVar5 != '\0') {
              uVar13 = (long)cvec.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start - cvec._0_8_ >> 2;
              if ((ulong)(long)pcVar4->n_batch <= uVar13) {
                uVar13 = (long)pcVar4->n_batch;
              }
              llama_batch_get_one(&local_160,cvec._0_8_,uVar13);
              local_218 = local_130;
              local_228 = local_140;
              uStack_224 = uStack_13c;
              uStack_220 = uStack_138;
              uStack_21c = uStack_134;
              local_238 = local_150;
              uStack_234 = uStack_14c;
              uStack_230 = uStack_148;
              uStack_22c = uStack_144;
              local_248 = local_160;
              uStack_244 = uStack_15c;
              uStack_240 = uStack_158;
              uStack_23c = uStack_154;
              llama_decode(local_1c8);
            }
            llama_kv_self_clear(local_1c8);
            llama_synchronize(local_1c8);
            llama_perf_context_reset(local_1c8);
            llama_set_warmup(local_1c8,0);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&cvec);
          }
          std::__uniq_ptr_impl<llama_model,_llama_model_deleter>::reset
                    ((__uniq_ptr_impl<llama_model,_llama_model_deleter> *)this,__p);
          std::__uniq_ptr_impl<llama_context,_llama_context_deleter>::reset
                    ((__uniq_ptr_impl<llama_context,_llama_context_deleter> *)&this->context,
                     local_1c8);
          return this;
        }
        bVar19 = (pcVar4->sampling).ignore_eos;
      }
      if ((bVar19 & 1) != 0) {
        local_178 = (vector<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>,std::allocator<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>>>
                     *)&(pcVar4->sampling).logit_bias;
        for (iVar6 = 0; iVar8 = llama_vocab_n_tokens(local_180), iVar6 < iVar8; iVar6 = iVar6 + 1) {
          cVar5 = llama_vocab_is_eog(local_180,iVar6);
          if (cVar5 != '\0') {
            if (-1 < common_log_verbosity_thold) {
              pcVar11 = common_log_main();
              common_token_to_piece_abi_cxx11_((string *)&cvec,local_1c8,iVar6,true);
              common_log_add(pcVar11,GGML_LOG_LEVEL_INFO,"%s: added %s logit bias = %f\n",0,
                             "common_init_from_params",cvec._0_8_);
              std::__cxx11::string::~string((string *)&cvec);
            }
            cvec._4_4_ = 0xff800000;
            cvec.n_embd = iVar6;
            std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>::
            emplace_back<llama_logit_bias>
                      ((vector<llama_logit_bias,_std::allocator<llama_logit_bias>_> *)local_178,
                       (llama_logit_bias *)&cvec);
          }
        }
      }
      goto LAB_001bafcb;
    }
    cvec.n_embd = 0;
    cvec._4_4_ = 0;
    __p_00 = (pointer)llama_adapter_lora_init(__p,(pcVar17->path)._M_dataplus._M_p);
    std::__uniq_ptr_impl<llama_adapter_lora,_llama_adapter_lora_deleter>::reset
              ((__uniq_ptr_impl<llama_adapter_lora,_llama_adapter_lora_deleter> *)&cvec,__p_00);
    uVar10 = cvec._0_8_;
    if (cvec._0_8_ == 0) {
      if (-1 < common_log_verbosity_thold) {
        pcVar11 = common_log_main();
        common_log_add(pcVar11,GGML_LOG_LEVEL_ERROR,"%s: failed to apply lora adapter \'%s\'\n",
                       "common_init_from_params",(pcVar17->path)._M_dataplus._M_p);
      }
      llama_free(local_1c8);
      bVar18 = true;
      llama_model_free(__p);
    }
    else {
      pcVar17->ptr = (llama_adapter_lora *)cvec._0_8_;
      std::
      vector<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>,std::allocator<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>>>
      ::emplace_back<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>>
                (local_178,(unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter> *)&cvec);
    }
    std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>::~unique_ptr
              ((unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter> *)&cvec);
    pcVar17 = pcVar17 + 1;
  } while (uVar10 != 0);
  __return_storage_ptr__ = local_1c0;
  if (bVar18) {
    return local_1c0;
  }
LAB_001baf8a:
  common_init_result::~common_init_result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

struct common_init_result common_init_from_params(common_params & params) {
    common_init_result iparams;
    auto mparams = common_model_params_to_llama(params);

    llama_model * model = llama_model_load_from_file(params.model.path.c_str(), mparams);
    if (model == NULL) {
        LOG_ERR("%s: failed to load model '%s'\n", __func__, params.model.path.c_str());
        return iparams;
    }

    const llama_vocab * vocab = llama_model_get_vocab(model);

    if (params.reranking) {
        bool ok = true;

        if (llama_vocab_bos(vocab) == LLAMA_TOKEN_NULL) {
            LOG_WRN("%s: warning: vocab does not have a  BOS token, reranking will not work\n", __func__);
            ok = false;
        }

        if (llama_vocab_eos(vocab) == LLAMA_TOKEN_NULL) {
            LOG_WRN("%s: warning: vocab does not have an EOS token, reranking will not work\n", __func__);
            ok = false;
        }

        if (llama_vocab_sep(vocab) == LLAMA_TOKEN_NULL) {
            LOG_WRN("%s: warning: vocab does not have a  SEP token, reranking will not work\n", __func__);
            ok = false;
        }

        if (!ok) {
            llama_model_free(model);

            return iparams;
        }
    }

    auto cparams = common_context_params_to_llama(params);

    llama_context * lctx = llama_init_from_model(model, cparams);
    if (lctx == NULL) {
        LOG_ERR("%s: failed to create context with model '%s'\n", __func__, params.model.path.c_str());
        llama_model_free(model);
        return iparams;
    }

    if (params.ctx_shift && !llama_kv_self_can_shift(lctx)) {
        LOG_WRN("%s: KV cache shifting is not supported for this context, disabling KV cache shifting\n", __func__);
        params.ctx_shift = false;
    }

    if (!params.control_vectors.empty()) {
        if (params.control_vector_layer_start <= 0) params.control_vector_layer_start = 1;
        if (params.control_vector_layer_end   <= 0) params.control_vector_layer_end   = llama_model_n_layer(model);

        const auto cvec = common_control_vector_load(params.control_vectors);
        if (cvec.n_embd == -1) {
            llama_free(lctx);
            llama_model_free(model);

            return iparams;
        }

        int err = llama_apply_adapter_cvec(
                lctx,
                cvec.data.data(),
                cvec.data.size(),
                cvec.n_embd,
                params.control_vector_layer_start,
                params.control_vector_layer_end);
        if (err) {
            llama_free(lctx);
            llama_model_free(model);

            return iparams;
        }
    }

    // load and optionally apply lora adapters
    for (auto & la : params.lora_adapters) {
        llama_adapter_lora_ptr lora;
        lora.reset(llama_adapter_lora_init(model, la.path.c_str()));
        if (lora == nullptr) {
            LOG_ERR("%s: failed to apply lora adapter '%s'\n", __func__, la.path.c_str());
            llama_free(lctx);
            llama_model_free(model);
            return iparams;
        }

        la.ptr = lora.get();
        iparams.lora.emplace_back(std::move(lora)); // copy to list of loaded adapters
    }

    if (!params.lora_init_without_apply) {
        common_set_adapter_lora(lctx, params.lora_adapters);
    }

    if (params.sampling.ignore_eos && llama_vocab_eos(vocab) == LLAMA_TOKEN_NULL) {
        LOG_WRN("%s: warning: vocab does not have an EOS token, ignoring --ignore-eos\n", __func__);
        params.sampling.ignore_eos = false;
    }

    if (params.sampling.ignore_eos) {
        for (llama_token i = 0; i < llama_vocab_n_tokens(vocab); i++) {
            if (llama_vocab_is_eog(vocab, i)) {
                LOG_INF("%s: added %s logit bias = %f\n", __func__, common_token_to_piece(lctx, i).c_str(), -INFINITY);
                params.sampling.logit_bias.push_back({i, -INFINITY});
            }
        }
    }

    if (params.sampling.penalty_last_n == -1) {
        LOG_INF("%s: setting penalty_last_n to ctx_size = %d\n", __func__, llama_n_ctx(lctx));
        params.sampling.penalty_last_n = llama_n_ctx(lctx);
    }

    if (params.sampling.dry_penalty_last_n == -1) {
        LOG_INF("%s: setting dry_penalty_last_n to ctx_size = %d\n", __func__, llama_n_ctx(lctx));
        params.sampling.dry_penalty_last_n = llama_n_ctx(lctx);
    }

    if (params.warmup) {
        LOG_WRN("%s: warming up the model with an empty run - please wait ... (--no-warmup to disable)\n", __func__);

        llama_set_warmup(lctx, true);

        std::vector<llama_token> tmp;
        llama_token bos = llama_vocab_bos(vocab);
        llama_token eos = llama_vocab_eos(vocab);

        // some models (e.g. T5) don't have a BOS token
        if (bos != LLAMA_TOKEN_NULL) {
            tmp.push_back(bos);
        }
        if (eos != LLAMA_TOKEN_NULL) {
            tmp.push_back(eos);
        }
        if (tmp.empty()) {
            tmp.push_back(0);
        }

        if (llama_model_has_encoder(model)) {
            llama_encode(lctx, llama_batch_get_one(tmp.data(), tmp.size()));
            llama_token decoder_start_token_id = llama_model_decoder_start_token(model);
            if (decoder_start_token_id == LLAMA_TOKEN_NULL) {
                decoder_start_token_id = bos;
            }
            tmp.clear();
            tmp.push_back(decoder_start_token_id);
        }
        if (llama_model_has_decoder(model)) {
            llama_decode(lctx, llama_batch_get_one(tmp.data(), std::min(tmp.size(), (size_t) params.n_batch)));
        }
        llama_kv_self_clear(lctx);
        llama_synchronize(lctx);
        llama_perf_context_reset(lctx);
        llama_set_warmup(lctx, false);
    }

    iparams.model.reset(model);
    iparams.context.reset(lctx);

    return iparams;
}